

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item.cpp
# Opt level: O3

void __thiscall
libtorrent::dht::item::assign
          (item *this,entry *v,span<const_char> salt,sequence_number seq,public_key *pk,
          secret_key *sk)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  span<char> out;
  __visit_result_t<libtorrent::aux::bencode_visitor<char_*>,_const_std::variant<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>_&>
  _Var4;
  int iVar5;
  dht *sk_00;
  span<const_char> msg;
  span<const_char> v_00;
  array<char,_1000UL> buffer;
  char str [1200];
  sequence_number sVar6;
  signature local_910;
  char local_8d0 [1000];
  char *local_4e8 [151];
  
  local_4e8[0] = local_8d0;
  local_910.bytes._M_elems._0_8_ = local_4e8;
  sVar6.value = seq.value;
  _Var4 = ::std::
          visit<libtorrent::aux::bencode_visitor<char*>,std::variant<long,std::__cxx11::string,std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>,boost::container::map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void>,std::vector<char,std::allocator<char>>,libtorrent::entry_types::uninitialized_type>const&>
                    ((bencode_visitor<char_*> *)&local_910,&v->super_variant_type);
  v_00.m_len = (long)_Var4;
  out.m_len = sVar6.value;
  out.m_ptr = (char *)0x4b0;
  v_00.m_ptr = local_8d0;
  sk_00 = (dht *)local_4e8;
  iVar5 = anon_unknown_8::canonical_string(v_00,seq,salt,out);
  msg.m_ptr = (char *)(long)iVar5;
  msg.m_len = (difference_type)pk;
  ed25519_sign(&local_910,(dht *)local_4e8,msg,(public_key *)sk,(secret_key *)sk_00);
  *(undefined8 *)((this->m_sig).bytes._M_elems + 0x30) = local_910.bytes._M_elems._48_8_;
  *(undefined8 *)((this->m_sig).bytes._M_elems + 0x38) = local_910.bytes._M_elems._56_8_;
  *(undefined8 *)((this->m_sig).bytes._M_elems + 0x20) = local_910.bytes._M_elems._32_8_;
  *(undefined8 *)((this->m_sig).bytes._M_elems + 0x28) = local_910.bytes._M_elems._40_8_;
  *(undefined8 *)((this->m_sig).bytes._M_elems + 0x10) = local_910.bytes._M_elems._16_8_;
  *(undefined8 *)((this->m_sig).bytes._M_elems + 0x18) = local_910.bytes._M_elems._24_8_;
  *(undefined8 *)(this->m_sig).bytes._M_elems = local_910.bytes._M_elems._0_8_;
  *(undefined8 *)((this->m_sig).bytes._M_elems + 8) = local_910.bytes._M_elems._8_8_;
  ::std::__cxx11::string::_M_replace
            ((ulong)&this->m_salt,0,(char *)(this->m_salt)._M_string_length,(ulong)salt.m_ptr);
  uVar1 = *(undefined8 *)((pk->bytes)._M_elems + 8);
  uVar2 = *(undefined8 *)((pk->bytes)._M_elems + 0x10);
  uVar3 = *(undefined8 *)((pk->bytes)._M_elems + 0x18);
  *(undefined8 *)(this->m_pk).bytes._M_elems = *(undefined8 *)(pk->bytes)._M_elems;
  *(undefined8 *)((this->m_pk).bytes._M_elems + 8) = uVar1;
  *(undefined8 *)((this->m_pk).bytes._M_elems + 0x10) = uVar2;
  *(undefined8 *)((this->m_pk).bytes._M_elems + 0x18) = uVar3;
  (this->m_seq).value = sVar6.value;
  this->m_mutable = true;
  entry::operator=(&this->m_value,v);
  return;
}

Assistant:

void item::assign(entry v, span<char const> salt
	, sequence_number const seq, public_key const& pk, secret_key const& sk)
{
	std::array<char, 1000> buffer;
	int const bsize = bencode(buffer.begin(), v);
	TORRENT_ASSERT(bsize <= 1000);
	m_sig = sign_mutable_item(span<char const>(buffer).first(bsize)
		, salt, seq, pk, sk);
	m_salt.assign(salt.data(), static_cast<std::size_t>(salt.size()));
	m_pk = pk;
	m_seq = seq;
	m_mutable = true;
	m_value = std::move(v);
}